

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# record_property_tests.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  ScopedSPITestFlag SVar1;
  bool bVar2;
  int iVar3;
  TestFlag *pTVar4;
  UnitTestSource *pUVar5;
  UnitTest *pUVar6;
  uint uVar7;
  char *__s;
  allocator<char> local_20d;
  ScopedSPITestFlag guard;
  iuCodeMessage local_208;
  AssertionResult iutest_spi_ar;
  int argc_local;
  SPIFailureChecker iutest_failure_checker;
  
  argc_local = argc;
  iutest::detail::InitIrisUnitTest<char**>(&argc_local,argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&iutest_failure_checker,"bar",(allocator<char> *)&local_208);
  iutest::Test::RecordProperty<char[2]>((string *)&iutest_failure_checker,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&iutest_failure_checker);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"name",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x68,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"tests",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x69,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"failures",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6a,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"disabled",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6b,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"skip",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6c,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"errors",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6d,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"time",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6e,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"timestamp",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  SVar1 = guard;
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)SVar1.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x6f,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  iutest::detail::SPIFailureChecker::SPIFailureChecker(&iutest_failure_checker,kNonFatalFailure);
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag(&guard);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_208,"random_seed",&local_20d);
  iutest::Test::RecordProperty<char[2]>(&local_208.m_message,(char (*) [2])0x127339);
  std::__cxx11::string::~string((string *)&local_208);
  pTVar4 = iutest::TestFlag::GetInstance();
  pTVar4->m_test_flags = (int)guard.super_ScopedGuard.m_test_flags;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,"Reserved key",(allocator<char> *)&guard);
  iutest::detail::SPIFailureChecker::GetResult
            (&iutest_spi_ar,&iutest_failure_checker,&local_208.m_message);
  std::__cxx11::string::~string((string *)&local_208);
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::~Collector(&iutest_failure_checker.super_Collector<iutest::detail::NoTestPartResultReporter>);
  if (iutest_spi_ar.m_result == false) {
    memset(&iutest_failure_checker,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_208,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/record_property_tests.cpp"
               ,0x70,iutest_spi_ar.m_message._M_dataplus._M_p);
    local_208._44_4_ = 1;
    iutest::AssertionHelper::operator=
              ((AssertionHelper *)&local_208,(Fixed *)&iutest_failure_checker);
    std::__cxx11::string::~string((string *)&local_208);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&iutest_failure_checker);
  }
  std::__cxx11::string::~string((string *)&iutest_spi_ar);
  pUVar5 = iutest::UnitTestSource::GetInstance();
  iVar3 = iutest::UnitTestSource::Run(pUVar5);
  if (iVar3 == 0) {
    pUVar6 = iutest::UnitTest::instance();
    bVar2 = CheckProperty(&(pUVar6->super_UnitTestImpl).m_ad_hoc_testresult,"bar","C");
    if (bVar2) {
      pUVar5 = iutest::UnitTestSource::GetInstance();
      iVar3 = iutest::UnitTestSource::Run(pUVar5);
      if (iVar3 != 0) {
        return 1;
      }
      pUVar6 = iutest::UnitTest::instance();
      bVar2 = CheckProperty(&(pUVar6->super_UnitTestImpl).m_ad_hoc_testresult,"bar","C");
      if (bVar2) {
        iutest::detail::InitIrisUnitTest<char**>(&argc_local,argv);
        pUVar5 = iutest::UnitTestSource::GetInstance();
        iVar3 = iutest::UnitTestSource::Run(pUVar5);
        if (iVar3 != 0) {
          return 1;
        }
        pUVar6 = iutest::UnitTest::instance();
        bVar2 = CheckProperty(&(pUVar6->super_UnitTestImpl).m_ad_hoc_testresult,"bar","C");
        __s = "*** Successful ***";
        if (bVar2) {
          __s = "ad hoc test result is not cleared?";
        }
        uVar7 = (uint)bVar2;
      }
      else {
        uVar7 = 1;
        __s = "ad hoc test result is cleared?";
      }
    }
    else {
      uVar7 = 1;
      __s = "ad hoc test result is not recorded";
    }
    puts(__s);
    return uVar7;
  }
  return 1;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);
    ::iutest::Test::RecordProperty("bar", "C");
#if !defined(IUTEST_USE_GTEST)
        // ban list
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("name"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("tests"      , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("failures"   , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("disabled"   , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("skip"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("errors"     , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("time"       , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("timestamp"  , "C"), "Reserved key");
    IUTEST_EXPECT_NONFATAL_FAILURE( ::iutest::Test::RecordProperty("random_seed", "C"), "Reserved key");
#endif

    {
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
#if !defined(IUTEST_NO_RECORDPROPERTY_OUTSIDE_TESTMETHOD_LIFESPAN)
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is not recorded\n");
            return 1;
        }
#endif
    }
#if !defined(IUTEST_NO_RECORDPROPERTY_OUTSIDE_TESTMETHOD_LIFESPAN)
    {
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is cleared?\n");
            return 1;
        }
    }
    {
        IUTEST_INIT(&argc, argv);
        const int ret = IUTEST_RUN_ALL_TESTS();
        if( ret != 0 ) return 1;
#if !defined(IUTEST_USE_GTEST)
        if( CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is not cleared?\n");
            return 1;
        }
#else
        if( !CheckProperty(iuutil::GetAdHocTestResult(), "bar", "C") )
        {
            printf("ad hoc test result is cleared? (iutest expect)\n");
            return 1;
        }
#endif
    }
#endif
    printf("*** Successful ***\n");
    return 0;
}